

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlValidCtxtPtr xmlNewValidCtxt(void)

{
  xmlValidCtxtPtr pxVar1;
  
  pxVar1 = (xmlValidCtxtPtr)(*xmlMalloc)(0x70);
  if (pxVar1 != (xmlValidCtxtPtr)0x0) {
    pxVar1->am = (xmlAutomataPtr)0x0;
    pxVar1->state = (xmlAutomataStatePtr)0x0;
    pxVar1->vstateNr = 0;
    pxVar1->vstateMax = 0;
    pxVar1->vstateTab = (xmlValidState *)0x0;
    *(undefined8 *)&pxVar1->valid = 0;
    pxVar1->vstate = (xmlValidState *)0x0;
    *(undefined8 *)&pxVar1->flags = 0;
    pxVar1->doc = (xmlDocPtr)0x0;
    pxVar1->nodeNr = 0;
    pxVar1->nodeMax = 0;
    pxVar1->nodeTab = (xmlNodePtr *)0x0;
    pxVar1->warning = (xmlValidityWarningFunc)0x0;
    pxVar1->node = (xmlNodePtr)0x0;
    pxVar1->userData = (void *)0x0;
    pxVar1->error = (xmlValidityErrorFunc)0x0;
  }
  return pxVar1;
}

Assistant:

xmlValidCtxtPtr xmlNewValidCtxt(void) {
    xmlValidCtxtPtr ret;

    ret = xmlMalloc(sizeof (xmlValidCtxt));
    if (ret == NULL)
	return (NULL);

    (void) memset(ret, 0, sizeof (xmlValidCtxt));

    return (ret);
}